

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_state.cpp
# Opt level: O3

void __thiscall
duckdb::PartitionLocalSinkState::Sink(PartitionLocalSinkState *this,DataChunk *input_chunk)

{
  DataChunk *pDVar1;
  atomic<unsigned_long> *paVar2;
  LocalSortStatePtr *this_00;
  unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
  *this_01;
  pointer pVVar3;
  BufferManager *pBVar4;
  pointer puVar5;
  pointer puVar6;
  undefined8 col_data;
  int iVar7;
  pointer pLVar8;
  reference this_02;
  type this_03;
  idx_t iVar9;
  type global_sort_state;
  undefined4 extraout_var;
  ulong uVar10;
  RowDataCollection *pRVar11;
  pointer pRVar12;
  type string_heap;
  reference pvVar13;
  reference other;
  pointer this_04;
  type state;
  SelectionVector *append_sel;
  reference this_05;
  pointer this_06;
  BlockHandle *pBVar14;
  size_t i;
  size_type __n;
  vector<duckdb::BufferHandle,_true> handles;
  Vector addresses;
  undefined1 local_e0 [48];
  LogicalType local_b0;
  Vector local_98;
  
  LOCK();
  paVar2 = &this->gstate->count;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + input_chunk->count;
  UNLOCK();
  if (this->sort_cols == 0) {
    this_01 = &this->rows;
    if ((this->rows).
        super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
        .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl ==
        (RowDataCollection *)0x0) {
      pVVar3 = (pointer)(this->payload_layout).row_width;
      local_e0._8_8_ = pVVar3;
      iVar7 = (*this->gstate->buffer_manager->_vptr_BufferManager[0xf])();
      local_e0._16_8_ = CONCAT44(extraout_var,iVar7);
      uVar10 = (ulong)local_e0._16_8_ / (ulong)pVVar3 + 1;
      iVar9 = 0x800;
      if (0x800 < uVar10) {
        iVar9 = uVar10;
      }
      pBVar4 = this->gstate->buffer_manager;
      pRVar11 = (RowDataCollection *)operator_new(0x80);
      RowDataCollection::RowDataCollection(pRVar11,pBVar4,iVar9,local_e0._8_8_,false);
      ::std::
      __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
      reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
             *)this_01,pRVar11);
      pBVar4 = this->gstate->buffer_manager;
      pRVar11 = (RowDataCollection *)operator_new(0x80);
      RowDataCollection::RowDataCollection(pRVar11,pBVar4,local_e0._16_8_,1,true);
      ::std::
      __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
      reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
             *)&this->strings,pRVar11);
    }
    iVar9 = input_chunk->count;
    local_e0._8_8_ = FlatVector::IncrementalSelectionVector();
    LogicalType::LogicalType(&local_b0,POINTER);
    Vector::Vector(&local_98,&local_b0,0x800);
    LogicalType::~LogicalType(&local_b0);
    pRVar12 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->(this_01);
    puVar5 = (pRVar12->blocks).
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar6 = (pRVar12->blocks).
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar12 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->(this_01);
    RowDataCollection::Build
              ((vector<duckdb::BufferHandle,_true> *)(local_e0 + 0x18),pRVar12,iVar9,
               (data_ptr_t *)local_98.data,(idx_t *)0x0,(SelectionVector *)local_e0._8_8_);
    DataChunk::ToUnifiedFormat((DataChunk *)local_e0);
    col_data = local_e0._0_8_;
    string_heap = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                  ::operator*(&this->strings);
    RowOperations::Scatter
              (input_chunk,(UnifiedVectorFormat *)col_data,&this->payload_layout,&local_98,
               string_heap,(SelectionVector *)local_e0._8_8_,iVar9);
    if ((this->payload_layout).all_constant == false) {
      uVar10 = (long)puVar5 - (long)puVar6 >> 3;
      while( true ) {
        pRVar12 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                  ::operator->(this_01);
        if ((ulong)((long)(pRVar12->blocks).
                          super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pRVar12->blocks).
                          super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar10) break;
        pRVar12 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                  ::operator->(this_01);
        this_05 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](&pRVar12->blocks,uVar10);
        this_06 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->(this_05);
        pBVar14 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&this_06->block);
        pBVar14->unswizzled = "PartitionLocalSinkState::Sink";
        uVar10 = uVar10 + 1;
      }
    }
    if ((pointer)local_e0._0_8_ != (pointer)0x0) {
      ::std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
                ((default_delete<duckdb::UnifiedVectorFormat[]> *)local_e0,
                 (UnifiedVectorFormat *)local_e0._0_8_);
    }
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
              ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
               (local_e0 + 0x18));
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_98.type);
  }
  else {
    if ((this->local_sort).
        super_unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>._M_t.
        super___uniq_ptr_impl<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
        .super__Head_base<0UL,_duckdb::LocalSortState_*,_false>._M_head_impl ==
        (LocalSortState *)0x0) {
      pDVar1 = &this->payload_chunk;
      DataChunk::Reset(pDVar1);
      pvVar13 = vector<duckdb::Vector,_true>::back(&pDVar1->data);
      Hash(this,input_chunk,pvVar13);
      if ((input_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (input_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          pvVar13 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,__n);
          other = vector<duckdb::Vector,_true>::operator[](&input_chunk->data,__n);
          Vector::Reference(pvVar13,other);
          __n = __n + 1;
        } while (__n < (ulong)(((long)(input_chunk->data).
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(input_chunk->data).
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              0x4ec4ec4ec4ec4ec5));
      }
      (this->payload_chunk).count = input_chunk->count;
      PartitionGlobalSinkState::UpdateLocalPartition
                (this->gstate,&this->local_partition,&this->local_append);
      this_04 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                ::operator->(&this->local_partition);
      state = unique_ptr<duckdb::PartitionedTupleDataAppendState,_std::default_delete<duckdb::PartitionedTupleDataAppendState>,_true>
              ::operator*(&this->local_append);
      append_sel = FlatVector::IncrementalSelectionVector();
      PartitionedTupleData::Append(this_04,state,pDVar1,append_sel,0xffffffffffffffff);
      return;
    }
    this_00 = &this->local_sort;
    pDVar1 = &this->group_chunk;
    DataChunk::Reset(pDVar1);
    ExpressionExecutor::Execute(&this->executor,input_chunk,pDVar1);
    pLVar8 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>::
             operator->(this_00);
    LocalSortState::SinkChunk(pLVar8,pDVar1,input_chunk);
    this_02 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
              ::operator[](&this->gstate->hash_groups,0);
    this_03 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
              ::operator*(this_02);
    LOCK();
    (this_03->count).super___atomic_base<unsigned_long>._M_i =
         (this_03->count).super___atomic_base<unsigned_long>._M_i + input_chunk->count;
    UNLOCK();
    pLVar8 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>::
             operator->(this_00);
    iVar9 = LocalSortState::SizeInBytes(pLVar8);
    if (this->gstate->memory_per_thread < iVar9) {
      global_sort_state =
           unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(&this_03->global_sort);
      pLVar8 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
               ::operator->(this_00);
      LocalSortState::Sort(pLVar8,global_sort_state,true);
      return;
    }
  }
  return;
}

Assistant:

void PartitionLocalSinkState::Sink(DataChunk &input_chunk) {
	gstate.count += input_chunk.size();

	// OVER()
	if (sort_cols == 0) {
		//	No sorts, so build paged row chunks
		if (!rows) {
			const auto entry_size = payload_layout.GetRowWidth();
			const auto block_size = gstate.buffer_manager.GetBlockSize();
			const auto capacity = MaxValue<idx_t>(STANDARD_VECTOR_SIZE, block_size / entry_size + 1);
			rows = make_uniq<RowDataCollection>(gstate.buffer_manager, capacity, entry_size);
			strings = make_uniq<RowDataCollection>(gstate.buffer_manager, block_size, 1U, true);
		}
		const auto row_count = input_chunk.size();
		const auto row_sel = FlatVector::IncrementalSelectionVector();
		Vector addresses(LogicalType::POINTER);
		auto key_locations = FlatVector::GetData<data_ptr_t>(addresses);
		const auto prev_rows_blocks = rows->blocks.size();
		auto handles = rows->Build(row_count, key_locations, nullptr, row_sel);
		auto input_data = input_chunk.ToUnifiedFormat();
		RowOperations::Scatter(input_chunk, input_data.get(), payload_layout, addresses, *strings, *row_sel, row_count);
		// Mark that row blocks contain pointers (heap blocks are pinned)
		if (!payload_layout.AllConstant()) {
			D_ASSERT(strings->keep_pinned);
			for (size_t i = prev_rows_blocks; i < rows->blocks.size(); ++i) {
				rows->blocks[i]->block->SetSwizzling("PartitionLocalSinkState::Sink");
			}
		}
		return;
	}

	if (local_sort) {
		//	OVER(ORDER BY...)
		group_chunk.Reset();
		executor.Execute(input_chunk, group_chunk);
		local_sort->SinkChunk(group_chunk, input_chunk);

		auto &hash_group = *gstate.hash_groups[0];
		hash_group.count += input_chunk.size();

		if (local_sort->SizeInBytes() > gstate.memory_per_thread) {
			auto &global_sort = *hash_group.global_sort;
			local_sort->Sort(global_sort, true);
		}
		return;
	}

	// OVER(...)
	payload_chunk.Reset();
	auto &hash_vector = payload_chunk.data.back();
	Hash(input_chunk, hash_vector);
	for (idx_t col_idx = 0; col_idx < input_chunk.ColumnCount(); ++col_idx) {
		payload_chunk.data[col_idx].Reference(input_chunk.data[col_idx]);
	}
	payload_chunk.SetCardinality(input_chunk);

	gstate.UpdateLocalPartition(local_partition, local_append);
	local_partition->Append(*local_append, payload_chunk);
}